

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satProof.c
# Opt level: O1

int Sat_ProofReduce(Vec_Set_t *vProof,void *pRoots,int hProofPivot)

{
  int iVar1;
  bool bVar2;
  word *pwVar3;
  uint uVar4;
  uint *__ptr;
  void *pvVar5;
  word **ppwVar6;
  byte bVar7;
  uint uVar8;
  ulong uVar9;
  word *pwVar10;
  long lVar11;
  uint uVar12;
  word wVar13;
  word *pwVar14;
  int iVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  timespec ts;
  timespec local_40;
  
  clock_gettime(3,&local_40);
  uVar4 = Proof_MarkUsedRec(vProof,(Vec_Int_t *)pRoots);
  __ptr = (uint *)malloc(0x10);
  uVar17 = 8;
  if (6 < uVar4 - 1) {
    uVar17 = uVar4;
  }
  __ptr[1] = 0;
  *__ptr = uVar17;
  if (uVar17 == 0) {
    pvVar5 = (void *)0x0;
  }
  else {
    pvVar5 = malloc((long)(int)uVar17 << 3);
  }
  *(void **)(__ptr + 2) = pvVar5;
  bVar7 = (byte)vProof->nPageSize;
  if ((vProof->iPage << (bVar7 & 0x1f)) + (int)*vProof->pPages[vProof->iPage] < 2) {
    __assert_fail("h <= Vec_SetHandCurrent(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecSet.h"
                  ,0x117,"void Vec_SetShrinkS(Vec_Set_t *, int)");
  }
  uVar9 = 2L >> (bVar7 & 0x3f);
  vProof->iPageS = (int)uVar9;
  vProof->pPages[uVar9][1] = (ulong)(vProof->uPageMask & 2);
  if (-1 < vProof->iPage) {
    lVar16 = 0;
    do {
      ppwVar6 = vProof->pPages;
      pwVar10 = ppwVar6[lVar16];
      if (2 < (int)*pwVar10) {
        uVar17 = 2;
        do {
          uVar9 = (ulong)uVar17;
          uVar4 = ((uint)pwVar10[uVar9] >> 3) + 3 >> 1;
          if (*(int *)((long)pwVar10 + uVar9 * 8 + 4) != 0) {
            bVar7 = (byte)vProof->nPageSize;
            iVar15 = 1 << (bVar7 & 0x1f);
            if (iVar15 <= (int)uVar4) {
              __assert_fail("nWords < (1 << p->nPageSize)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecSet.h"
                            ,0xef,"int Vec_SetAppendS(Vec_Set_t *, int)");
            }
            iVar1 = vProof->iPageS;
            if (iVar15 <= (int)((int)ppwVar6[iVar1][1] + uVar4)) {
              vProof->iPageS = iVar1 + 1;
              ppwVar6[(long)iVar1 + 1][1] = 2;
            }
            pwVar10 = pwVar10 + uVar9;
            iVar15 = vProof->iPageS;
            wVar13 = ppwVar6[iVar15][1] + (ulong)uVar4;
            ppwVar6[iVar15][1] = wVar13;
            uVar8 = ((iVar15 << (bVar7 & 0x1f)) - uVar4) + (int)wVar13;
            *(uint *)((long)pwVar10 + 4) = uVar8;
            if ((int)uVar8 < 1) {
              __assert_fail("pNode->Id > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satProof.c"
                            ,0x19b,"int Sat_ProofReduce(Vec_Set_t *, void *, int)");
            }
            uVar8 = __ptr[1];
            uVar12 = *__ptr;
            if (uVar8 == uVar12) {
              if ((int)uVar12 < 0x10) {
                if (*(void **)(__ptr + 2) == (void *)0x0) {
                  pvVar5 = malloc(0x80);
                }
                else {
                  pvVar5 = realloc(*(void **)(__ptr + 2),0x80);
                }
                uVar18 = 0x10;
              }
              else {
                uVar18 = uVar12 * 2;
                if ((int)uVar18 <= (int)uVar12) goto LAB_00929b38;
                if (*(void **)(__ptr + 2) == (void *)0x0) {
                  pvVar5 = malloc((ulong)uVar12 << 4);
                }
                else {
                  pvVar5 = realloc(*(void **)(__ptr + 2),(ulong)uVar12 << 4);
                }
              }
              *(void **)(__ptr + 2) = pvVar5;
              *__ptr = uVar18;
            }
LAB_00929b38:
            __ptr[1] = uVar8 + 1;
            *(word **)(*(long *)(__ptr + 2) + (long)(int)uVar8 * 8) = pwVar10;
            if (7 < (uint)*pwVar10) {
              uVar9 = 0;
              do {
                uVar8 = *(uint *)((long)pwVar10 + uVar9 * 4 + 8);
                if ((uVar8 & 1) == 0) {
                  uVar12 = (int)uVar8 >> 2;
                  if ((int)uVar12 < 1) goto LAB_00929dba;
                  pwVar14 = vProof->pPages[uVar12 >> ((byte)vProof->nPageSize & 0x1f)] +
                            (uVar12 & vProof->uPageMask);
                }
                else {
                  pwVar14 = (word *)0x0;
                }
                if ((uVar8 & 1) == 0) {
                  if (*(int *)((long)pwVar14 + 4) < 1) {
                    __assert_fail("pFanin->Id > 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satProof.c"
                                  ,0x1a1,"int Sat_ProofReduce(Vec_Set_t *, void *, int)");
                  }
                  *(uint *)((long)pwVar10 + uVar9 * 4 + 8) =
                       (uVar8 & 2) + *(int *)((long)pwVar14 + 4) * 4;
                }
                uVar9 = uVar9 + 1;
              } while (uVar9 < (uint)*pwVar10 >> 3);
            }
          }
          uVar17 = uVar4 + uVar17;
          ppwVar6 = vProof->pPages;
          pwVar10 = ppwVar6[lVar16];
        } while ((int)uVar17 < (int)*pwVar10);
      }
      bVar2 = lVar16 < vProof->iPage;
      lVar16 = lVar16 + 1;
    } while (bVar2);
  }
  if (1 < *(int *)((long)pRoots + 4)) {
    lVar16 = *(long *)((long)pRoots + 8);
    lVar11 = 1;
    do {
      uVar17 = *(uint *)(lVar16 + lVar11 * 4);
      if ((int)uVar17 < 1) {
LAB_00929dba:
        __assert_fail("h > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satProof.c"
                      ,0x3a,"satset *Proof_NodeRead(Vec_Set_t *, int)");
      }
      if (vProof->pPages[uVar17 >> ((byte)vProof->nPageSize & 0x1f)] == (word *)0x0) break;
      *(undefined4 *)(lVar16 + lVar11 * 4) =
           *(undefined4 *)
            ((long)vProof->pPages[uVar17 >> ((byte)vProof->nPageSize & 0x1f)] +
            (ulong)(uVar17 & vProof->uPageMask) * 8 + 4);
      lVar11 = lVar11 + 1;
    } while (lVar11 < *(int *)((long)pRoots + 4));
  }
  if (0 < hProofPivot) {
    bVar7 = (byte)vProof->nPageSize;
    ppwVar6 = vProof->pPages;
    if (hProofPivot <= (vProof->iPage << (bVar7 & 0x1f)) + (int)*ppwVar6[vProof->iPage]) {
      uVar4 = (vProof->iPageS << (bVar7 & 0x1f)) + (int)ppwVar6[vProof->iPageS][1];
      uVar17 = __ptr[1];
      if (0 < (long)(int)uVar17) {
        pwVar10 = ppwVar6[(uint)hProofPivot >> (bVar7 & 0x1f)] + (hProofPivot & vProof->uPageMask);
        lVar16 = *(long *)(__ptr + 2);
        lVar11 = 0;
        do {
          pwVar14 = *(word **)(lVar16 + lVar11 * 8);
          uVar8 = *(uint *)((long)pwVar14 + 4);
          *(uint *)((long)pwVar14 + 4) = 0;
          if ((uint)*pwVar14 < 8) {
            __assert_fail("nEnts > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satProof.c"
                          ,0x3b,"int Proof_NodeWordNum(int)");
          }
          memmove(vProof->pPages[(int)uVar8 >> ((byte)vProof->nPageSize & 0x1f)] +
                  (int)(vProof->uPageMask & uVar8),pwVar14,
                  (ulong)(((uint)*pwVar14 >> 1) + 4 & 0xfffffff8) + 8);
          pwVar3 = (word *)0x0;
          if (pwVar14 < pwVar10) {
            uVar8 = uVar4;
            pwVar3 = pwVar10;
          }
          if (pwVar10 == (word *)0x0) {
            uVar8 = uVar4;
            pwVar3 = pwVar10;
          }
          pwVar10 = pwVar3;
          uVar4 = uVar8;
          lVar11 = lVar11 + 1;
        } while ((int)uVar17 != lVar11);
      }
      vProof->nEntries = uVar17;
      if (*(void **)(__ptr + 2) != (void *)0x0) {
        free(*(void **)(__ptr + 2));
        __ptr[2] = 0;
        __ptr[3] = 0;
      }
      free(__ptr);
      ppwVar6 = vProof->pPages;
      bVar7 = (byte)vProof->nPageSize;
      uVar17 = (vProof->iPageS << (bVar7 & 0x1f)) + (int)ppwVar6[vProof->iPageS][1];
      if ((int)uVar17 <= (vProof->iPage << (bVar7 & 0x1f)) + (int)*ppwVar6[vProof->iPage]) {
        iVar15 = (int)uVar17 >> (bVar7 & 0x1f);
        vProof->iPage = iVar15;
        *ppwVar6[iVar15] = (long)(int)(uVar17 & vProof->uPageMask);
        if (-1 < iVar15) {
          uVar9 = 0;
          do {
            *ppwVar6[uVar9] = (long)(int)ppwVar6[uVar9][1];
            uVar9 = uVar9 + 1;
          } while (iVar15 + 1 != uVar9);
        }
        return uVar4;
      }
      __assert_fail("h <= Vec_SetHandCurrent(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecSet.h"
                    ,0x111,"void Vec_SetShrink(Vec_Set_t *, int)");
    }
  }
  __assert_fail("hProofPivot >= 1 && hProofPivot <= Vec_SetHandCurrent(vProof)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satProof.c"
                ,0x1ab,"int Sat_ProofReduce(Vec_Set_t *, void *, int)");
}

Assistant:

int Sat_ProofReduce( Vec_Set_t * vProof, void * pRoots, int hProofPivot )
{
//    Vec_Set_t * vProof   = (Vec_Set_t *)&s->Proofs;
//    Vec_Int_t * vRoots   = (Vec_Int_t *)&s->claProofs;
    Vec_Int_t * vRoots   = (Vec_Int_t *)pRoots;
//    Vec_Int_t * vClauses = (Vec_Int_t *)&s->clauses;
    int fVerbose = 0;
    Vec_Ptr_t * vUsed;
    satset * pNode, * pFanin, * pPivot;
    int i, j, k, hTemp, nSize;
    abctime clk = Abc_Clock();
    static abctime TimeTotal = 0;
    int RetValue;
//Sat_ProofCheck0( vProof );

    // collect visited nodes
    nSize = Proof_MarkUsedRec( vProof, vRoots );
    vUsed = Vec_PtrAlloc( nSize );
//Sat_ProofCheck0( vProof );

    // relabel nodes to use smaller space
    Vec_SetShrinkS( vProof, 2 );
    Vec_SetForEachEntry( satset *, vProof, nSize, pNode, i, j )
    {
        nSize = Vec_SetWordNum( 2 + pNode->nEnts );
        if ( pNode->Id == 0 ) 
            continue;
        pNode->Id = Vec_SetAppendS( vProof, 2 + pNode->nEnts );
        assert( pNode->Id > 0 );
        Vec_PtrPush( vUsed, pNode );
        // update fanins
        Proof_NodeForeachFanin( vProof, pNode, pFanin, k )
            if ( (pNode->pEnts[k] & 1) == 0 ) // proof node
            {
                assert( pFanin->Id > 0 );
                pNode->pEnts[k] = (pFanin->Id << 2) | (pNode->pEnts[k] & 2);
            }
//            else // problem clause
//                assert( (int*)pFanin >= Vec_IntArray(vClauses) && (int*)pFanin < Vec_IntArray(vClauses)+Vec_IntSize(vClauses) );
    }
    // update roots
    Proof_ForeachNodeVec1( vRoots, vProof, pNode, i )
        Vec_IntWriteEntry( vRoots, i, pNode->Id );
    // determine new pivot
    assert( hProofPivot >= 1 && hProofPivot <= Vec_SetHandCurrent(vProof) );
    pPivot = Proof_NodeRead( vProof, hProofPivot );
    RetValue = Vec_SetHandCurrentS(vProof);
    // compact the nodes
    Vec_PtrForEachEntry( satset *, vUsed, pNode, i )
    {
        hTemp = pNode->Id; pNode->Id = 0;
        memmove( Vec_SetEntry(vProof, hTemp), pNode, sizeof(word)*Proof_NodeWordNum(pNode->nEnts) );
        if ( pPivot && pPivot <= pNode )
        {
            RetValue = hTemp;
            pPivot = NULL;
        }
    }
    Vec_SetWriteEntryNum( vProof, Vec_PtrSize(vUsed) );
    Vec_PtrFree( vUsed );

    // report the result
    if ( fVerbose )
    {
        printf( "\n" );
        printf( "The proof was reduced from %6.2f MB to %6.2f MB (by %6.2f %%)  ", 
            1.0 * Vec_SetMemory(vProof) / (1<<20), 1.0 * Vec_SetMemoryS(vProof) / (1<<20), 
            100.0 * (Vec_SetMemory(vProof) - Vec_SetMemoryS(vProof)) / Vec_SetMemory(vProof) );
        TimeTotal += Abc_Clock() - clk;
        Abc_PrintTime( 1, "Time", TimeTotal );
    }
    Vec_SetShrink( vProof, Vec_SetHandCurrentS(vProof) );
    Vec_SetShrinkLimits( vProof );
//    Sat_ProofReduceCheck( s );
//Sat_ProofCheck0( vProof );

    return RetValue;
}